

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coreaction.cc
# Opt level: O3

void ActionMarkExplicit::processMultiplier(Varnode *vn,int4 max)

{
  uint uVar1;
  int iVar2;
  PcodeOp *pPVar3;
  Varnode *v;
  int iVar4;
  vector<ActionMarkExplicit::OpStackElement,_std::allocator<ActionMarkExplicit::OpStackElement>_>
  opstack;
  vector<ActionMarkExplicit::OpStackElement,_std::allocator<ActionMarkExplicit::OpStackElement>_>
  local_58;
  OpStackElement local_40;
  
  local_58.
  super__Vector_base<ActionMarkExplicit::OpStackElement,_std::allocator<ActionMarkExplicit::OpStackElement>_>
  ._M_impl.super__Vector_impl_data._M_start = (OpStackElement *)0x0;
  local_58.
  super__Vector_base<ActionMarkExplicit::OpStackElement,_std::allocator<ActionMarkExplicit::OpStackElement>_>
  ._M_impl.super__Vector_impl_data._M_finish = (OpStackElement *)0x0;
  local_58.
  super__Vector_base<ActionMarkExplicit::OpStackElement,_std::allocator<ActionMarkExplicit::OpStackElement>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (OpStackElement *)0x0;
  OpStackElement::OpStackElement(&local_40,vn);
  iVar4 = 0;
  std::
  vector<ActionMarkExplicit::OpStackElement,_std::allocator<ActionMarkExplicit::OpStackElement>_>::
  _M_realloc_insert<ActionMarkExplicit::OpStackElement>(&local_58,(iterator)0x0,&local_40);
  do {
    uVar1 = (local_58.
             super__Vector_base<ActionMarkExplicit::OpStackElement,_std::allocator<ActionMarkExplicit::OpStackElement>_>
             ._M_impl.super__Vector_impl_data._M_finish[-1].vn)->flags;
    if ((uVar1 & 0x90) == 0x10) {
      iVar2 = local_58.
              super__Vector_base<ActionMarkExplicit::OpStackElement,_std::allocator<ActionMarkExplicit::OpStackElement>_>
              ._M_impl.super__Vector_impl_data._M_finish[-1].slot;
      if (local_58.
          super__Vector_base<ActionMarkExplicit::OpStackElement,_std::allocator<ActionMarkExplicit::OpStackElement>_>
          ._M_impl.super__Vector_impl_data._M_finish[-1].slotback <= iVar2) goto LAB_002e4e75;
      pPVar3 = (local_58.
                super__Vector_base<ActionMarkExplicit::OpStackElement,_std::allocator<ActionMarkExplicit::OpStackElement>_>
                ._M_impl.super__Vector_impl_data._M_finish[-1].vn)->def;
      local_58.
      super__Vector_base<ActionMarkExplicit::OpStackElement,_std::allocator<ActionMarkExplicit::OpStackElement>_>
      ._M_impl.super__Vector_impl_data._M_finish[-1].slot = iVar2 + 1;
      v = (pPVar3->inrefs).super__Vector_base<Varnode_*,_std::allocator<Varnode_*>_>._M_impl.
          super__Vector_impl_data._M_start[iVar2];
      if ((v->flags & 1) != 0) {
        Varnode::setFlags(vn,0x80);
        Varnode::clearFlags(vn,0x40);
      }
      OpStackElement::OpStackElement(&local_40,v);
      if (local_58.
          super__Vector_base<ActionMarkExplicit::OpStackElement,_std::allocator<ActionMarkExplicit::OpStackElement>_>
          ._M_impl.super__Vector_impl_data._M_finish ==
          local_58.
          super__Vector_base<ActionMarkExplicit::OpStackElement,_std::allocator<ActionMarkExplicit::OpStackElement>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::
        vector<ActionMarkExplicit::OpStackElement,_std::allocator<ActionMarkExplicit::OpStackElement>_>
        ::_M_realloc_insert<ActionMarkExplicit::OpStackElement>
                  (&local_58,
                   (iterator)
                   local_58.
                   super__Vector_base<ActionMarkExplicit::OpStackElement,_std::allocator<ActionMarkExplicit::OpStackElement>_>
                   ._M_impl.super__Vector_impl_data._M_finish,&local_40);
      }
      else {
        (local_58.
         super__Vector_base<ActionMarkExplicit::OpStackElement,_std::allocator<ActionMarkExplicit::OpStackElement>_>
         ._M_impl.super__Vector_impl_data._M_finish)->vn = local_40.vn;
        (local_58.
         super__Vector_base<ActionMarkExplicit::OpStackElement,_std::allocator<ActionMarkExplicit::OpStackElement>_>
         ._M_impl.super__Vector_impl_data._M_finish)->slot = local_40.slot;
        (local_58.
         super__Vector_base<ActionMarkExplicit::OpStackElement,_std::allocator<ActionMarkExplicit::OpStackElement>_>
         ._M_impl.super__Vector_impl_data._M_finish)->slotback = local_40.slotback;
        local_58.
        super__Vector_base<ActionMarkExplicit::OpStackElement,_std::allocator<ActionMarkExplicit::OpStackElement>_>
        ._M_impl.super__Vector_impl_data._M_finish =
             local_58.
             super__Vector_base<ActionMarkExplicit::OpStackElement,_std::allocator<ActionMarkExplicit::OpStackElement>_>
             ._M_impl.super__Vector_impl_data._M_finish + 1;
      }
    }
    else {
      iVar4 = (iVar4 + 1) - (uint)((uVar1 >> 0x12 & 1) != 0);
LAB_002e4e75:
      if (max < iVar4) {
        Varnode::setFlags(vn,0x80);
        Varnode::clearFlags(vn,0x40);
        goto LAB_002e4ec2;
      }
      local_58.
      super__Vector_base<ActionMarkExplicit::OpStackElement,_std::allocator<ActionMarkExplicit::OpStackElement>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           local_58.
           super__Vector_base<ActionMarkExplicit::OpStackElement,_std::allocator<ActionMarkExplicit::OpStackElement>_>
           ._M_impl.super__Vector_impl_data._M_finish + -1;
    }
    if (local_58.
        super__Vector_base<ActionMarkExplicit::OpStackElement,_std::allocator<ActionMarkExplicit::OpStackElement>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        local_58.
        super__Vector_base<ActionMarkExplicit::OpStackElement,_std::allocator<ActionMarkExplicit::OpStackElement>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
LAB_002e4ec2:
      if (local_58.
          super__Vector_base<ActionMarkExplicit::OpStackElement,_std::allocator<ActionMarkExplicit::OpStackElement>_>
          ._M_impl.super__Vector_impl_data._M_start != (OpStackElement *)0x0) {
        operator_delete(local_58.
                        super__Vector_base<ActionMarkExplicit::OpStackElement,_std::allocator<ActionMarkExplicit::OpStackElement>_>
                        ._M_impl.super__Vector_impl_data._M_start);
      }
      return;
    }
  } while( true );
}

Assistant:

void ActionMarkExplicit::processMultiplier(Varnode *vn,int4 max)

{
  vector<OpStackElement> opstack;
  Varnode *vncur;
  int4 finalcount = 0;

  opstack.push_back(vn);
  do {
    vncur = opstack.back().vn;
    bool isaterm = vncur->isExplicit() || (!vncur->isWritten());
    if (isaterm || (opstack.back().slotback<=opstack.back().slot)) { // Trimming condition
      if (isaterm) {
	if (!vncur->isSpacebase()) // Don't count space base
	  finalcount += 1;
      }
      if (finalcount > max) {
	vn->setExplicit();	// Make this variable explicit
	vn->clearImplied();
	return;
      }
      opstack.pop_back();
    }
    else {
      PcodeOp *op = vncur->getDef();
      Varnode *newvn = op->getIn(opstack.back().slot++);
      if (newvn->isMark()) {	// If an ancestor is marked(also possible implied with multiple descendants)
	vn->setExplicit();	// then automatically consider this to be explicit
	vn->clearImplied();
      }
      opstack.push_back(newvn);
    }
  } while(!opstack.empty());
}